

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  int iVar874;
  ulong uVar875;
  ulong uVar876;
  ulong uVar877;
  ulong uVar878;
  ulong uVar879;
  ulong uVar880;
  ulong uVar881;
  ulong uVar882;
  ulong uVar883;
  ulong uVar884;
  long lVar885;
  ulong uVar886;
  ulong uVar887;
  uint64_t uVar888;
  ulong uVar889;
  ulong uVar890;
  ulong uVar891;
  ulong uVar892;
  uint64_t uVar893;
  ulong uVar894;
  ulong uVar895;
  ulong uVar896;
  uint64_t uVar897;
  ulong uVar898;
  ulong uVar899;
  ulong uVar900;
  ulong uVar901;
  ulong uVar902;
  ulong uVar903;
  ulong uVar904;
  ulong uVar905;
  uint64_t uVar906;
  ulong uVar907;
  ulong uVar908;
  ulong uVar909;
  ulong uVar910;
  ulong uVar911;
  ulong uVar912;
  uint64_t uVar913;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      uVar883 = (b->z).n[0];
      uVar894 = (b->z).n[1];
      uVar884 = (b->z).n[3];
      uVar910 = uVar883 * 2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar884;
      auVar457._8_8_ = 0;
      auVar457._0_8_ = uVar910;
      uVar902 = (b->z).n[2];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar902;
      auVar458._8_8_ = 0;
      auVar458._0_8_ = uVar894 * 2;
      uVar905 = (b->z).n[4];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar905;
      auVar459._8_8_ = 0;
      auVar459._0_8_ = uVar905;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = SUB168(auVar3 * auVar459,0);
      auVar1 = auVar4 * ZEXT816(0x1000003d10) + auVar2 * auVar458 + auVar1 * auVar457;
      uVar889 = uVar905 * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar889;
      auVar460._8_8_ = 0;
      auVar460._0_8_ = uVar883;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar884;
      auVar461._8_8_ = 0;
      auVar461._0_8_ = uVar894 * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar902;
      auVar462._8_8_ = 0;
      auVar462._0_8_ = uVar902;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(auVar3 * auVar459,8);
      auVar4 = auVar8 * ZEXT816(0x1000003d10000) +
               auVar5 * auVar460 + auVar7 * auVar462 + auVar6 * auVar461 + (auVar1 >> 0x34);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar883;
      auVar463._8_8_ = 0;
      auVar463._0_8_ = uVar883;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar889;
      auVar464._8_8_ = 0;
      auVar464._0_8_ = uVar894;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar884;
      auVar465._8_8_ = 0;
      auVar465._0_8_ = uVar902 * 2;
      auVar2 = auVar11 * auVar465 + auVar10 * auVar464 + (auVar4 >> 0x34);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
      auVar3 = auVar12 * ZEXT816(0x1000003d1) + auVar9 * auVar463;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar894;
      auVar466._8_8_ = 0;
      auVar466._0_8_ = uVar910;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar889;
      auVar467._8_8_ = 0;
      auVar467._0_8_ = uVar902;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar884;
      auVar468._8_8_ = 0;
      auVar468._0_8_ = uVar884;
      auVar2 = auVar15 * auVar468 + auVar14 * auVar467 + (auVar2 >> 0x34);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar5 = (auVar3 >> 0x34) + auVar13 * auVar466 + auVar16 * ZEXT816(0x1000003d10);
      uVar875 = auVar5._0_8_;
      uVar900 = auVar5._8_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar902;
      auVar469._8_8_ = 0;
      auVar469._0_8_ = uVar910;
      auVar817._8_8_ = uVar900 >> 0x34;
      auVar817._0_8_ = uVar900 * 0x1000 | uVar875 >> 0x34;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar894;
      auVar470._8_8_ = 0;
      auVar470._0_8_ = uVar894;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar889;
      auVar471._8_8_ = 0;
      auVar471._0_8_ = uVar884;
      auVar2 = auVar19 * auVar471 + (auVar2 >> 0x34);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar2._0_8_;
      auVar817 = auVar20 * ZEXT816(0x1000003d10) + auVar18 * auVar470 + auVar17 * auVar469 +
                 auVar817;
      auVar5 = auVar817 >> 0x34;
      auVar826._8_8_ = 0;
      auVar826._0_8_ = auVar5._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auVar2._8_8_;
      auVar825._8_8_ = auVar5._8_8_;
      auVar825._0_8_ = auVar1._0_8_ & 0xffffffffffffe;
      auVar826 = auVar21 * ZEXT816(0x1000003d10000) + auVar825 + auVar826;
      uVar876 = auVar826._0_8_;
      uVar910 = (a->z).n[0];
      uVar889 = (a->z).n[3];
      uVar892 = uVar910 * 2;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar889;
      auVar472._8_8_ = 0;
      auVar472._0_8_ = uVar892;
      uVar900 = (a->z).n[1];
      uVar904 = (a->z).n[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar904;
      auVar473._8_8_ = 0;
      auVar473._0_8_ = uVar900 * 2;
      uVar898 = (auVar826._8_8_ << 0xc | uVar876 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
      uVar887 = (a->z).n[4];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar887;
      auVar474._8_8_ = 0;
      auVar474._0_8_ = uVar887;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = SUB168(auVar24 * auVar474,0);
      auVar1 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar473 + auVar22 * auVar472;
      uVar896 = uVar887 * 2;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar896;
      auVar475._8_8_ = 0;
      auVar475._0_8_ = uVar910;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar889;
      auVar476._8_8_ = 0;
      auVar476._0_8_ = uVar900 * 2;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar904;
      auVar477._8_8_ = 0;
      auVar477._0_8_ = uVar904;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = SUB168(auVar24 * auVar474,8);
      auVar2 = auVar29 * ZEXT816(0x1000003d10000) +
               auVar26 * auVar475 + auVar28 * auVar477 + auVar27 * auVar476 + (auVar1 >> 0x34);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar910;
      auVar478._8_8_ = 0;
      auVar478._0_8_ = uVar910;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar896;
      auVar479._8_8_ = 0;
      auVar479._0_8_ = uVar900;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar889;
      auVar480._8_8_ = 0;
      auVar480._0_8_ = uVar904 * 2;
      auVar4 = auVar32 * auVar480 + auVar31 * auVar479 + (auVar2 >> 0x34);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar5 = auVar33 * ZEXT816(0x1000003d1) + auVar30 * auVar478;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar900;
      auVar481._8_8_ = 0;
      auVar481._0_8_ = uVar892;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar896;
      auVar482._8_8_ = 0;
      auVar482._0_8_ = uVar904;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar889;
      auVar483._8_8_ = 0;
      auVar483._0_8_ = uVar889;
      auVar4 = auVar35 * auVar482 + auVar36 * auVar483 + (auVar4 >> 0x34);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar6 = auVar37 * ZEXT816(0x1000003d10) + auVar34 * auVar481 + (auVar5 >> 0x34);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar904;
      auVar484._8_8_ = 0;
      auVar484._0_8_ = uVar892;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar900;
      auVar485._8_8_ = 0;
      auVar485._0_8_ = uVar900;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar896;
      auVar486._8_8_ = 0;
      auVar486._0_8_ = uVar889;
      auVar4 = auVar40 * auVar486 + (auVar4 >> 0x34);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = auVar4._0_8_;
      auVar7 = auVar41 * ZEXT816(0x1000003d10) + auVar39 * auVar485 + auVar38 * auVar484 +
               (auVar6 >> 0x34);
      auVar8 = auVar7 >> 0x34;
      auVar828._8_8_ = 0;
      auVar828._0_8_ = auVar8._0_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = auVar4._8_8_;
      auVar827._8_8_ = auVar8._8_8_;
      auVar827._0_8_ = auVar1._0_8_ & 0xffffffffffffe;
      auVar828 = auVar42 * ZEXT816(0x1000003d10000) + auVar827 + auVar828;
      uVar877 = auVar828._0_8_;
      uVar876 = uVar876 & 0xfffffffffffff;
      uVar892 = (a->x).n[0];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar876;
      auVar487._8_8_ = 0;
      auVar487._0_8_ = uVar892;
      uVar878 = auVar817._0_8_ & 0xfffffffffffff;
      uVar896 = (a->x).n[1];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar878;
      auVar488._8_8_ = 0;
      auVar488._0_8_ = uVar896;
      uVar875 = uVar875 & 0xfffffffffffff;
      uVar901 = (a->x).n[2];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar875;
      auVar489._8_8_ = 0;
      auVar489._0_8_ = uVar901;
      uVar879 = auVar3._0_8_ & 0xfffffffffffff;
      uVar909 = (a->x).n[3];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar879;
      auVar490._8_8_ = 0;
      auVar490._0_8_ = uVar909;
      uVar912 = (a->x).n[4];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar898;
      auVar491._8_8_ = 0;
      auVar491._0_8_ = uVar912;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = SUB168(auVar47 * auVar491,0);
      uVar907 = (auVar828._8_8_ << 0xc | uVar877 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      auVar1 = auVar48 * ZEXT816(0x1000003d10) +
               auVar43 * auVar487 + auVar46 * auVar490 + auVar45 * auVar489 + auVar44 * auVar488;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar898;
      auVar492._8_8_ = 0;
      auVar492._0_8_ = uVar892;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar876;
      auVar493._8_8_ = 0;
      auVar493._0_8_ = uVar896;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar878;
      auVar494._8_8_ = 0;
      auVar494._0_8_ = uVar901;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar875;
      auVar495._8_8_ = 0;
      auVar495._0_8_ = uVar909;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar879;
      auVar496._8_8_ = 0;
      auVar496._0_8_ = uVar912;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = SUB168(auVar47 * auVar491,8);
      auVar2 = auVar54 * ZEXT816(0x1000003d10000) +
               auVar51 * auVar494 + auVar53 * auVar496 + auVar52 * auVar495 + auVar50 * auVar493 +
               auVar49 * auVar492 + (auVar1 >> 0x34);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar879;
      auVar497._8_8_ = 0;
      auVar497._0_8_ = uVar892;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar898;
      auVar498._8_8_ = 0;
      auVar498._0_8_ = uVar896;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar876;
      auVar499._8_8_ = 0;
      auVar499._0_8_ = uVar901;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar878;
      auVar500._8_8_ = 0;
      auVar500._0_8_ = uVar909;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar875;
      auVar501._8_8_ = 0;
      auVar501._0_8_ = uVar912;
      auVar3 = auVar59 * auVar501 + auVar58 * auVar500 + auVar57 * auVar499 + auVar56 * auVar498 +
               (auVar2 >> 0x34);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar60 * ZEXT816(0x1000003d1) + auVar55 * auVar497;
      uVar880 = auVar4._0_8_;
      uVar903 = auVar4._8_8_;
      auVar818._8_8_ = uVar903 >> 0x34;
      auVar818._0_8_ = uVar903 * 0x1000 | uVar880 >> 0x34;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar875;
      auVar502._8_8_ = 0;
      auVar502._0_8_ = uVar892;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar879;
      auVar503._8_8_ = 0;
      auVar503._0_8_ = uVar896;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar898;
      auVar504._8_8_ = 0;
      auVar504._0_8_ = uVar901;
      uVar880 = uVar880 & 0xfffffffffffff;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar876;
      auVar505._8_8_ = 0;
      auVar505._0_8_ = uVar909;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar878;
      auVar506._8_8_ = 0;
      auVar506._0_8_ = uVar912;
      auVar3 = auVar63 * auVar504 + auVar65 * auVar506 + auVar64 * auVar505 + (auVar3 >> 0x34);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar818 = auVar66 * ZEXT816(0x1000003d10) + auVar62 * auVar503 + auVar61 * auVar502 +
                 auVar818;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar878;
      auVar507._8_8_ = 0;
      auVar507._0_8_ = uVar892;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar875;
      auVar508._8_8_ = 0;
      auVar508._0_8_ = uVar896;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar879;
      auVar509._8_8_ = 0;
      auVar509._0_8_ = uVar901;
      uVar886 = auVar818._0_8_ & 0xfffffffffffff;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar898;
      auVar510._8_8_ = 0;
      auVar510._0_8_ = uVar909;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar876;
      auVar511._8_8_ = 0;
      auVar511._0_8_ = uVar912;
      auVar3 = auVar71 * auVar511 + auVar70 * auVar510 + (auVar3 >> 0x34);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = auVar3._0_8_;
      auVar4 = auVar72 * ZEXT816(0x1000003d10) +
               auVar67 * auVar507 + auVar69 * auVar509 + auVar68 * auVar508 + (auVar818 >> 0x34);
      auVar8 = auVar4 >> 0x34;
      auVar830._8_8_ = 0;
      auVar830._0_8_ = auVar8._0_8_;
      uVar890 = auVar4._0_8_ & 0xfffffffffffff;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = auVar3._8_8_;
      auVar829._8_8_ = auVar8._8_8_;
      auVar829._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar830 = auVar73 * ZEXT816(0x1000003d10000) + auVar829 + auVar830;
      uVar895 = auVar830._0_8_;
      uVar877 = uVar877 & 0xfffffffffffff;
      uVar892 = (b->x).n[0];
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar877;
      auVar512._8_8_ = 0;
      auVar512._0_8_ = uVar892;
      uVar911 = auVar7._0_8_ & 0xfffffffffffff;
      uVar896 = (b->x).n[1];
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar911;
      auVar513._8_8_ = 0;
      auVar513._0_8_ = uVar896;
      uVar903 = auVar6._0_8_ & 0xfffffffffffff;
      uVar901 = (b->x).n[2];
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar903;
      auVar514._8_8_ = 0;
      auVar514._0_8_ = uVar901;
      uVar881 = auVar5._0_8_ & 0xfffffffffffff;
      uVar909 = (b->x).n[3];
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar881;
      auVar515._8_8_ = 0;
      auVar515._0_8_ = uVar909;
      uVar908 = (auVar830._8_8_ << 0xc | uVar895 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      uVar912 = (b->x).n[4];
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar907;
      auVar516._8_8_ = 0;
      auVar516._0_8_ = uVar912;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = SUB168(auVar78 * auVar516,0);
      uVar895 = uVar895 & 0xfffffffffffff;
      auVar1 = auVar79 * ZEXT816(0x1000003d10) +
               auVar75 * auVar513 + auVar77 * auVar515 + auVar76 * auVar514 + auVar74 * auVar512;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar907;
      auVar517._8_8_ = 0;
      auVar517._0_8_ = uVar892;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar877;
      auVar518._8_8_ = 0;
      auVar518._0_8_ = uVar896;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar911;
      auVar519._8_8_ = 0;
      auVar519._0_8_ = uVar901;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar903;
      auVar520._8_8_ = 0;
      auVar520._0_8_ = uVar909;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar881;
      auVar521._8_8_ = 0;
      auVar521._0_8_ = uVar912;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = SUB168(auVar78 * auVar516,8);
      auVar2 = auVar85 * ZEXT816(0x1000003d10000) +
               auVar81 * auVar518 + auVar82 * auVar519 + auVar84 * auVar521 + auVar83 * auVar520 +
               auVar80 * auVar517 + (auVar1 >> 0x34);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar881;
      auVar522._8_8_ = 0;
      auVar522._0_8_ = uVar892;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar907;
      auVar523._8_8_ = 0;
      auVar523._0_8_ = uVar896;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar877;
      auVar524._8_8_ = 0;
      auVar524._0_8_ = uVar901;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar911;
      auVar525._8_8_ = 0;
      auVar525._0_8_ = uVar909;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar903;
      auVar526._8_8_ = 0;
      auVar526._0_8_ = uVar912;
      auVar3 = auVar90 * auVar526 + auVar89 * auVar525 + auVar88 * auVar524 + auVar87 * auVar523 +
               (auVar2 >> 0x34);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar7 = auVar91 * ZEXT816(0x1000003d1) + auVar86 * auVar522;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar903;
      auVar527._8_8_ = 0;
      auVar527._0_8_ = uVar892;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar881;
      auVar528._8_8_ = 0;
      auVar528._0_8_ = uVar896;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar907;
      auVar529._8_8_ = 0;
      auVar529._0_8_ = uVar901;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar877;
      auVar530._8_8_ = 0;
      auVar530._0_8_ = uVar909;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar911;
      auVar531._8_8_ = 0;
      auVar531._0_8_ = uVar912;
      auVar4 = auVar94 * auVar529 + auVar96 * auVar531 + auVar95 * auVar530 + (auVar3 >> 0x34);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar3 = auVar97 * ZEXT816(0x1000003d10) + auVar92 * auVar527 + auVar93 * auVar528 +
               (auVar7 >> 0x34);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar911;
      auVar532._8_8_ = 0;
      auVar532._0_8_ = uVar892;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar903;
      auVar533._8_8_ = 0;
      auVar533._0_8_ = uVar896;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar881;
      auVar534._8_8_ = 0;
      auVar534._0_8_ = uVar901;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar907;
      auVar535._8_8_ = 0;
      auVar535._0_8_ = uVar909;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar877;
      auVar536._8_8_ = 0;
      auVar536._0_8_ = uVar912;
      auVar4 = auVar102 * auVar536 + auVar101 * auVar535 + (auVar4 >> 0x34);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = auVar4._0_8_;
      auVar5 = auVar103 * ZEXT816(0x1000003d10) +
               auVar98 * auVar532 + auVar100 * auVar534 + auVar99 * auVar533 + (auVar3 >> 0x34);
      auVar6 = auVar5 >> 0x34;
      auVar832._8_8_ = 0;
      auVar832._0_8_ = auVar6._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = auVar4._8_8_;
      auVar831._8_8_ = auVar6._8_8_;
      auVar831._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar832 = auVar104 * ZEXT816(0x1000003d10000) + auVar831 + auVar832;
      uVar891 = auVar832._0_8_;
      uVar892 = (a->y).n[0];
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar876;
      auVar537._8_8_ = 0;
      auVar537._0_8_ = uVar892;
      uVar896 = (a->y).n[1];
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar878;
      auVar538._8_8_ = 0;
      auVar538._0_8_ = uVar896;
      uVar901 = (a->y).n[2];
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar875;
      auVar539._8_8_ = 0;
      auVar539._0_8_ = uVar901;
      uVar909 = (a->y).n[3];
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar879;
      auVar540._8_8_ = 0;
      auVar540._0_8_ = uVar909;
      uVar912 = (a->y).n[4];
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar898;
      auVar541._8_8_ = 0;
      auVar541._0_8_ = uVar912;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = SUB168(auVar109 * auVar541,0);
      auVar1 = auVar110 * ZEXT816(0x1000003d10) +
               auVar105 * auVar537 + auVar106 * auVar538 + auVar108 * auVar540 + auVar107 * auVar539
      ;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar898;
      auVar542._8_8_ = 0;
      auVar542._0_8_ = uVar892;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uVar876;
      auVar543._8_8_ = 0;
      auVar543._0_8_ = uVar896;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar878;
      auVar544._8_8_ = 0;
      auVar544._0_8_ = uVar901;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar875;
      auVar545._8_8_ = 0;
      auVar545._0_8_ = uVar909;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uVar879;
      auVar546._8_8_ = 0;
      auVar546._0_8_ = uVar912;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = SUB168(auVar109 * auVar541,8);
      auVar4 = auVar116 * ZEXT816(0x1000003d10000) +
               auVar111 * auVar542 +
               auVar112 * auVar543 + auVar113 * auVar544 + auVar114 * auVar545 + auVar115 * auVar546
               + (auVar1 >> 0x34);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = uVar879;
      auVar547._8_8_ = 0;
      auVar547._0_8_ = uVar892;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = uVar898;
      auVar548._8_8_ = 0;
      auVar548._0_8_ = uVar896;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uVar876;
      auVar549._8_8_ = 0;
      auVar549._0_8_ = uVar901;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = uVar878;
      auVar550._8_8_ = 0;
      auVar550._0_8_ = uVar909;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = uVar875;
      auVar551._8_8_ = 0;
      auVar551._0_8_ = uVar912;
      auVar6 = (auVar4 >> 0x34) +
               auVar121 * auVar551 + auVar120 * auVar550 + auVar119 * auVar549 + auVar118 * auVar548
      ;
      uVar882 = auVar6._0_8_;
      uVar899 = auVar6._8_8_;
      auVar833._8_8_ = uVar899 >> 0x34;
      auVar833._0_8_ = uVar899 * 0x1000 | uVar882 >> 0x34;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = uVar882 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar4._6_2_ & 0xf);
      auVar6 = auVar117 * auVar547 + auVar122 * ZEXT816(0x1000003d1);
      uVar882 = auVar6._0_8_;
      uVar899 = auVar6._8_8_;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uVar875;
      auVar552._8_8_ = 0;
      auVar552._0_8_ = uVar892;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uVar879;
      auVar553._8_8_ = 0;
      auVar553._0_8_ = uVar896;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = uVar898;
      auVar554._8_8_ = 0;
      auVar554._0_8_ = uVar901;
      auVar834._8_8_ = uVar899 >> 0x34;
      auVar834._0_8_ = uVar899 * 0x1000 | uVar882 >> 0x34;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = uVar876;
      auVar555._8_8_ = 0;
      auVar555._0_8_ = uVar909;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar878;
      auVar556._8_8_ = 0;
      auVar556._0_8_ = uVar912;
      auVar833 = auVar125 * auVar554 + auVar127 * auVar556 + auVar126 * auVar555 + auVar833;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = auVar833._0_8_ & 0xfffffffffffff;
      auVar834 = auVar128 * ZEXT816(0x1000003d10) + auVar123 * auVar552 + auVar124 * auVar553 +
                 auVar834;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = uVar878;
      auVar557._8_8_ = 0;
      auVar557._0_8_ = uVar892;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar875;
      auVar558._8_8_ = 0;
      auVar558._0_8_ = uVar896;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uVar879;
      auVar559._8_8_ = 0;
      auVar559._0_8_ = uVar901;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uVar898;
      auVar560._8_8_ = 0;
      auVar560._0_8_ = uVar909;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = uVar876;
      auVar561._8_8_ = 0;
      auVar561._0_8_ = uVar912;
      auVar6 = auVar133 * auVar561 + auVar132 * auVar560 + (auVar833 >> 0x34);
      auVar134._8_8_ = 0;
      auVar134._0_8_ = auVar6._0_8_;
      auVar8 = auVar134 * ZEXT816(0x1000003d10) +
               auVar131 * auVar559 + auVar130 * auVar558 + auVar129 * auVar557 + (auVar834 >> 0x34);
      auVar9 = auVar8 >> 0x34;
      auVar836._8_8_ = 0;
      auVar836._0_8_ = auVar9._0_8_;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = auVar6._8_8_;
      auVar835._8_8_ = auVar9._8_8_;
      auVar835._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar836 = auVar135 * ZEXT816(0x1000003d10000) + auVar835 + auVar836;
      uVar909 = auVar836._0_8_;
      uVar882 = uVar882 & 0xfffffffffffff;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uVar882;
      auVar562._8_8_ = 0;
      auVar562._0_8_ = uVar884;
      uVar901 = (auVar836._8_8_ << 0xc | uVar909 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
      uVar892 = auVar834._0_8_ & 0xfffffffffffff;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uVar892;
      auVar563._8_8_ = 0;
      auVar563._0_8_ = uVar902;
      uVar912 = auVar8._0_8_ & 0xfffffffffffff;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar912;
      auVar564._8_8_ = 0;
      auVar564._0_8_ = uVar894;
      uVar909 = uVar909 & 0xfffffffffffff;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = uVar909;
      auVar565._8_8_ = 0;
      auVar565._0_8_ = uVar883;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar901;
      auVar566._8_8_ = 0;
      auVar566._0_8_ = uVar905;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = SUB168(auVar140 * auVar566,0);
      auVar8 = auVar137 * auVar563 + auVar136 * auVar562 + auVar138 * auVar564 + auVar139 * auVar565
               + auVar141 * ZEXT816(0x1000003d10);
      auVar142._8_8_ = 0;
      auVar142._0_8_ = uVar882;
      auVar567._8_8_ = 0;
      auVar567._0_8_ = uVar905;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = uVar892;
      auVar568._8_8_ = 0;
      auVar568._0_8_ = uVar884;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uVar912;
      auVar569._8_8_ = 0;
      auVar569._0_8_ = uVar902;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar909;
      auVar570._8_8_ = 0;
      auVar570._0_8_ = uVar894;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar901;
      auVar571._8_8_ = 0;
      auVar571._0_8_ = uVar883;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = SUB168(auVar140 * auVar566,8);
      auVar1 = auVar147 * ZEXT816(0x1000003d10000) +
               auVar146 * auVar571 +
               auVar145 * auVar570 + auVar144 * auVar569 + auVar143 * auVar568 + auVar142 * auVar567
               + (auVar8 >> 0x34);
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar882;
      auVar572._8_8_ = 0;
      auVar572._0_8_ = uVar883;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar892;
      auVar573._8_8_ = 0;
      auVar573._0_8_ = uVar905;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar912;
      auVar574._8_8_ = 0;
      auVar574._0_8_ = uVar884;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar909;
      auVar575._8_8_ = 0;
      auVar575._0_8_ = uVar902;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar901;
      auVar576._8_8_ = 0;
      auVar576._0_8_ = uVar894;
      auVar4 = auVar152 * auVar576 + auVar151 * auVar575 + auVar150 * auVar574 + auVar149 * auVar573
               + (auVar1 >> 0x34);
      auVar153._8_8_ = 0;
      auVar153._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar6 = auVar148 * auVar572 + auVar153 * ZEXT816(0x1000003d1);
      uVar875 = auVar6._0_8_;
      uVar896 = auVar6._8_8_;
      auVar819._8_8_ = uVar896 >> 0x34;
      auVar819._0_8_ = uVar896 * 0x1000 | uVar875 >> 0x34;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = uVar882;
      auVar577._8_8_ = 0;
      auVar577._0_8_ = uVar894;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = uVar892;
      auVar578._8_8_ = 0;
      auVar578._0_8_ = uVar883;
      uVar875 = uVar875 & 0xfffffffffffff;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = uVar912;
      auVar579._8_8_ = 0;
      auVar579._0_8_ = uVar905;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = uVar909;
      auVar580._8_8_ = 0;
      auVar580._0_8_ = uVar884;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = uVar901;
      auVar581._8_8_ = 0;
      auVar581._0_8_ = uVar902;
      auVar4 = auVar158 * auVar581 + auVar157 * auVar580 + auVar156 * auVar579 + (auVar4 >> 0x34);
      auVar159._8_8_ = 0;
      auVar159._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar819 = auVar159 * ZEXT816(0x1000003d10) + auVar154 * auVar577 + auVar155 * auVar578 +
                 auVar819;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = uVar882;
      auVar582._8_8_ = 0;
      auVar582._0_8_ = uVar902;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = uVar892;
      auVar583._8_8_ = 0;
      auVar583._0_8_ = uVar894;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = uVar912;
      auVar584._8_8_ = 0;
      auVar584._0_8_ = uVar883;
      uVar882 = auVar819._0_8_ & 0xfffffffffffff;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = uVar909;
      auVar585._8_8_ = 0;
      auVar585._0_8_ = uVar905;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = uVar901;
      auVar586._8_8_ = 0;
      auVar586._0_8_ = uVar884;
      auVar4 = auVar164 * auVar586 + auVar163 * auVar585 + (auVar4 >> 0x34);
      auVar165._8_8_ = 0;
      auVar165._0_8_ = auVar4._0_8_;
      auVar6 = auVar165 * ZEXT816(0x1000003d10) +
               auVar162 * auVar584 + auVar161 * auVar583 + auVar160 * auVar582 + (auVar819 >> 0x34);
      auVar9 = auVar6 >> 0x34;
      auVar838._8_8_ = 0;
      auVar838._0_8_ = auVar9._0_8_;
      uVar879 = auVar6._0_8_ & 0xfffffffffffff;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = auVar4._8_8_;
      auVar837._8_8_ = auVar9._8_8_;
      auVar837._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
      auVar838 = auVar166 * ZEXT816(0x1000003d10000) + auVar837 + auVar838;
      uVar878 = auVar838._0_8_;
      uVar892 = (b->y).n[0];
      auVar167._8_8_ = 0;
      auVar167._0_8_ = uVar877;
      auVar587._8_8_ = 0;
      auVar587._0_8_ = uVar892;
      uVar896 = (b->y).n[1];
      auVar168._8_8_ = 0;
      auVar168._0_8_ = uVar911;
      auVar588._8_8_ = 0;
      auVar588._0_8_ = uVar896;
      uVar899 = (auVar838._8_8_ << 0xc | uVar878 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
      uVar901 = (b->y).n[2];
      auVar169._8_8_ = 0;
      auVar169._0_8_ = uVar903;
      auVar589._8_8_ = 0;
      auVar589._0_8_ = uVar901;
      uVar909 = (b->y).n[3];
      uVar912 = (b->y).n[4];
      auVar170._8_8_ = 0;
      auVar170._0_8_ = uVar881;
      auVar590._8_8_ = 0;
      auVar590._0_8_ = uVar909;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = uVar907;
      auVar591._8_8_ = 0;
      auVar591._0_8_ = uVar912;
      auVar172._8_8_ = 0;
      auVar172._0_8_ = SUB168(auVar171 * auVar591,0);
      uVar878 = uVar878 & 0xfffffffffffff;
      auVar1 = auVar172 * ZEXT816(0x1000003d10) +
               auVar167 * auVar587 + auVar168 * auVar588 + auVar170 * auVar590 + auVar169 * auVar589
      ;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = uVar907;
      auVar592._8_8_ = 0;
      auVar592._0_8_ = uVar892;
      auVar174._8_8_ = 0;
      auVar174._0_8_ = uVar877;
      auVar593._8_8_ = 0;
      auVar593._0_8_ = uVar896;
      auVar175._8_8_ = 0;
      auVar175._0_8_ = uVar911;
      auVar594._8_8_ = 0;
      auVar594._0_8_ = uVar901;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = uVar903;
      auVar595._8_8_ = 0;
      auVar595._0_8_ = uVar909;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = uVar881;
      auVar596._8_8_ = 0;
      auVar596._0_8_ = uVar912;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = SUB168(auVar171 * auVar591,8);
      auVar4 = auVar178 * ZEXT816(0x1000003d10000) +
               auVar173 * auVar592 +
               auVar174 * auVar593 + auVar177 * auVar596 + auVar176 * auVar595 + auVar175 * auVar594
               + (auVar1 >> 0x34);
      auVar179._8_8_ = 0;
      auVar179._0_8_ = uVar881;
      auVar597._8_8_ = 0;
      auVar597._0_8_ = uVar892;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = uVar907;
      auVar598._8_8_ = 0;
      auVar598._0_8_ = uVar896;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = uVar877;
      auVar599._8_8_ = 0;
      auVar599._0_8_ = uVar901;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = uVar911;
      auVar600._8_8_ = 0;
      auVar600._0_8_ = uVar909;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = uVar903;
      auVar601._8_8_ = 0;
      auVar601._0_8_ = uVar912;
      auVar6 = (auVar4 >> 0x34) +
               auVar183 * auVar601 + auVar182 * auVar600 + auVar181 * auVar599 + auVar180 * auVar598
      ;
      uVar876 = auVar6._0_8_;
      uVar898 = auVar6._8_8_;
      auVar839._8_8_ = uVar898 >> 0x34;
      auVar839._0_8_ = uVar898 * 0x1000 | uVar876 >> 0x34;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = uVar876 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar4._6_2_ & 0xf);
      auVar6 = auVar179 * auVar597 + auVar184 * ZEXT816(0x1000003d1);
      uVar876 = auVar6._0_8_;
      uVar898 = auVar6._8_8_;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = uVar903;
      auVar602._8_8_ = 0;
      auVar602._0_8_ = uVar892;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = uVar881;
      auVar603._8_8_ = 0;
      auVar603._0_8_ = uVar896;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = uVar907;
      auVar604._8_8_ = 0;
      auVar604._0_8_ = uVar901;
      auVar840._8_8_ = uVar898 >> 0x34;
      auVar840._0_8_ = uVar898 * 0x1000 | uVar876 >> 0x34;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = uVar877;
      auVar605._8_8_ = 0;
      auVar605._0_8_ = uVar909;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = uVar911;
      auVar606._8_8_ = 0;
      auVar606._0_8_ = uVar912;
      auVar839 = auVar187 * auVar604 + auVar189 * auVar606 + auVar188 * auVar605 + auVar839;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = auVar839._0_8_ & 0xfffffffffffff;
      auVar840 = auVar190 * ZEXT816(0x1000003d10) + auVar185 * auVar602 + auVar186 * auVar603 +
                 auVar840;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = uVar911;
      auVar607._8_8_ = 0;
      auVar607._0_8_ = uVar892;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = uVar903;
      auVar608._8_8_ = 0;
      auVar608._0_8_ = uVar896;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = uVar881;
      auVar609._8_8_ = 0;
      auVar609._0_8_ = uVar901;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = uVar907;
      auVar610._8_8_ = 0;
      auVar610._0_8_ = uVar909;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = uVar877;
      auVar611._8_8_ = 0;
      auVar611._0_8_ = uVar912;
      auVar6 = auVar195 * auVar611 + auVar194 * auVar610 + (auVar839 >> 0x34);
      auVar196._8_8_ = 0;
      auVar196._0_8_ = auVar6._0_8_;
      auVar8 = auVar196 * ZEXT816(0x1000003d10) +
               auVar191 * auVar607 + auVar193 * auVar609 + auVar192 * auVar608 + (auVar840 >> 0x34);
      auVar9 = auVar8 >> 0x34;
      auVar842._8_8_ = 0;
      auVar842._0_8_ = auVar9._0_8_;
      auVar197._8_8_ = 0;
      auVar197._0_8_ = auVar6._8_8_;
      auVar841._8_8_ = auVar9._8_8_;
      auVar841._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar842 = auVar197 * ZEXT816(0x1000003d10000) + auVar841 + auVar842;
      uVar877 = auVar842._0_8_;
      uVar876 = uVar876 & 0xfffffffffffff;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = uVar876;
      auVar612._8_8_ = 0;
      auVar612._0_8_ = uVar889;
      uVar909 = (auVar842._8_8_ << 0xc | uVar877 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
      uVar912 = auVar840._0_8_ & 0xfffffffffffff;
      auVar199._8_8_ = 0;
      auVar199._0_8_ = uVar912;
      auVar613._8_8_ = 0;
      auVar613._0_8_ = uVar904;
      uVar896 = auVar8._0_8_ & 0xfffffffffffff;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = uVar896;
      auVar614._8_8_ = 0;
      auVar614._0_8_ = uVar900;
      uVar877 = uVar877 & 0xfffffffffffff;
      auVar201._8_8_ = 0;
      auVar201._0_8_ = uVar877;
      auVar615._8_8_ = 0;
      auVar615._0_8_ = uVar910;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = uVar909;
      auVar616._8_8_ = 0;
      auVar616._0_8_ = uVar887;
      auVar203._8_8_ = 0;
      auVar203._0_8_ = SUB168(auVar202 * auVar616,0);
      auVar8 = auVar199 * auVar613 + auVar198 * auVar612 + auVar200 * auVar614 + auVar201 * auVar615
               + auVar203 * ZEXT816(0x1000003d10);
      auVar204._8_8_ = 0;
      auVar204._0_8_ = uVar876;
      auVar617._8_8_ = 0;
      auVar617._0_8_ = uVar887;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = uVar912;
      auVar618._8_8_ = 0;
      auVar618._0_8_ = uVar889;
      auVar206._8_8_ = 0;
      auVar206._0_8_ = uVar896;
      auVar619._8_8_ = 0;
      auVar619._0_8_ = uVar904;
      auVar207._8_8_ = 0;
      auVar207._0_8_ = uVar877;
      auVar620._8_8_ = 0;
      auVar620._0_8_ = uVar900;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = uVar909;
      auVar621._8_8_ = 0;
      auVar621._0_8_ = uVar910;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = SUB168(auVar202 * auVar616,8);
      auVar1 = auVar209 * ZEXT816(0x1000003d10000) +
               auVar208 * auVar621 +
               auVar207 * auVar620 + auVar206 * auVar619 + auVar204 * auVar617 + auVar205 * auVar618
               + (auVar8 >> 0x34);
      auVar210._8_8_ = 0;
      auVar210._0_8_ = uVar876;
      auVar622._8_8_ = 0;
      auVar622._0_8_ = uVar910;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = uVar912;
      auVar623._8_8_ = 0;
      auVar623._0_8_ = uVar887;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = uVar896;
      auVar624._8_8_ = 0;
      auVar624._0_8_ = uVar889;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = uVar877;
      auVar625._8_8_ = 0;
      auVar625._0_8_ = uVar904;
      auVar214._8_8_ = 0;
      auVar214._0_8_ = uVar909;
      auVar626._8_8_ = 0;
      auVar626._0_8_ = uVar900;
      auVar4 = auVar214 * auVar626 + auVar213 * auVar625 + auVar212 * auVar624 + auVar211 * auVar623
               + (auVar1 >> 0x34);
      auVar215._8_8_ = 0;
      auVar215._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar6 = auVar210 * auVar622 + auVar215 * ZEXT816(0x1000003d1);
      uVar892 = auVar6._0_8_;
      uVar901 = auVar6._8_8_;
      auVar820._8_8_ = uVar901 >> 0x34;
      auVar820._0_8_ = uVar901 * 0x1000 | uVar892 >> 0x34;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = uVar876;
      auVar627._8_8_ = 0;
      auVar627._0_8_ = uVar900;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = uVar912;
      auVar628._8_8_ = 0;
      auVar628._0_8_ = uVar910;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = uVar896;
      auVar629._8_8_ = 0;
      auVar629._0_8_ = uVar887;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = uVar877;
      auVar630._8_8_ = 0;
      auVar630._0_8_ = uVar889;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = uVar909;
      auVar631._8_8_ = 0;
      auVar631._0_8_ = uVar904;
      auVar4 = auVar220 * auVar631 + auVar219 * auVar630 + auVar218 * auVar629 + (auVar4 >> 0x34);
      auVar221._8_8_ = 0;
      auVar221._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar820 = auVar221 * ZEXT816(0x1000003d10) + auVar216 * auVar627 + auVar217 * auVar628 +
                 auVar820;
      auVar222._8_8_ = 0;
      auVar222._0_8_ = uVar876;
      auVar632._8_8_ = 0;
      auVar632._0_8_ = uVar904;
      auVar223._8_8_ = 0;
      auVar223._0_8_ = uVar912;
      auVar633._8_8_ = 0;
      auVar633._0_8_ = uVar900;
      auVar224._8_8_ = 0;
      auVar224._0_8_ = uVar896;
      auVar634._8_8_ = 0;
      auVar634._0_8_ = uVar910;
      auVar225._8_8_ = 0;
      auVar225._0_8_ = uVar877;
      auVar635._8_8_ = 0;
      auVar635._0_8_ = uVar887;
      auVar226._8_8_ = 0;
      auVar226._0_8_ = uVar909;
      auVar636._8_8_ = 0;
      auVar636._0_8_ = uVar889;
      auVar4 = auVar226 * auVar636 + auVar225 * auVar635 + (auVar4 >> 0x34);
      auVar227._8_8_ = 0;
      auVar227._0_8_ = auVar4._0_8_;
      auVar6 = auVar227 * ZEXT816(0x1000003d10) +
               auVar224 * auVar634 + auVar223 * auVar633 + auVar222 * auVar632 + (auVar820 >> 0x34);
      auVar9 = auVar6 >> 0x34;
      auVar844._8_8_ = 0;
      auVar844._0_8_ = auVar9._0_8_;
      auVar228._8_8_ = 0;
      auVar228._0_8_ = auVar4._8_8_;
      auVar843._8_8_ = auVar9._8_8_;
      auVar843._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
      auVar844 = auVar228 * ZEXT816(0x1000003d10000) + auVar843 + auVar844;
      uVar901 = auVar844._0_8_;
      uVar912 = (0x3ffffbfffff0bc - uVar880) + (auVar7._0_8_ & 0xfffffffffffff);
      uVar877 = (0x3ffffffffffffc - uVar886) + (auVar3._0_8_ & 0xfffffffffffff);
      uVar881 = (0x3ffffffffffffc - uVar890) + (auVar5._0_8_ & 0xfffffffffffff);
      uVar876 = (0x3ffffffffffffc - uVar895) + (uVar891 & 0xfffffffffffff);
      uVar909 = (auVar832._8_8_ << 0xc | uVar891 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff) +
                (0x3fffffffffffc - uVar908);
      uVar891 = (0x3ffffbfffff0bc - (uVar892 & 0xfffffffffffff)) + uVar875;
      uVar903 = (0x3ffffffffffffc - (auVar820._0_8_ & 0xfffffffffffff)) + uVar882;
      uVar892 = (0x3ffffffffffffc - (auVar6._0_8_ & 0xfffffffffffff)) + uVar879;
      uVar896 = (0x3ffffffffffffc - (uVar901 & 0xfffffffffffff)) + uVar878;
      uVar901 = (0x3fffffffffffc -
                ((auVar844._8_8_ << 0xc | uVar901 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff))) +
                uVar899;
      local_80.n[0] = uVar891;
      local_80.n[1] = uVar903;
      local_80.n[2] = uVar892;
      local_80.n[3] = uVar896;
      local_80.n[4] = uVar901;
      local_58.n[0] = uVar912;
      local_58.n[1] = uVar877;
      local_58.n[2] = uVar881;
      local_58.n[3] = uVar876;
      local_58.n[4] = uVar909;
      iVar874 = secp256k1_fe_impl_normalizes_to_zero_var(&local_58);
      if (iVar874 == 0) {
        auVar229._8_8_ = 0;
        auVar229._0_8_ = uVar912;
        auVar637._8_8_ = 0;
        auVar637._0_8_ = uVar884;
        auVar230._8_8_ = 0;
        auVar230._0_8_ = uVar877;
        auVar638._8_8_ = 0;
        auVar638._0_8_ = uVar902;
        auVar231._8_8_ = 0;
        auVar231._0_8_ = uVar881;
        auVar639._8_8_ = 0;
        auVar639._0_8_ = uVar894;
        auVar232._8_8_ = 0;
        auVar232._0_8_ = uVar876;
        auVar640._8_8_ = 0;
        auVar640._0_8_ = uVar883;
        auVar233._8_8_ = 0;
        auVar233._0_8_ = uVar909;
        auVar641._8_8_ = 0;
        auVar641._0_8_ = uVar905;
        auVar234._8_8_ = 0;
        auVar234._0_8_ = SUB168(auVar233 * auVar641,0);
        auVar1 = auVar234 * ZEXT816(0x1000003d10) +
                 auVar230 * auVar638 + auVar229 * auVar637 + auVar231 * auVar639 +
                 auVar232 * auVar640;
        auVar235._8_8_ = 0;
        auVar235._0_8_ = uVar912;
        auVar642._8_8_ = 0;
        auVar642._0_8_ = uVar905;
        auVar236._8_8_ = 0;
        auVar236._0_8_ = uVar877;
        auVar643._8_8_ = 0;
        auVar643._0_8_ = uVar884;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = uVar881;
        auVar644._8_8_ = 0;
        auVar644._0_8_ = uVar902;
        auVar238._8_8_ = 0;
        auVar238._0_8_ = uVar876;
        auVar645._8_8_ = 0;
        auVar645._0_8_ = uVar894;
        auVar239._8_8_ = 0;
        auVar239._0_8_ = uVar909;
        auVar646._8_8_ = 0;
        auVar646._0_8_ = uVar883;
        auVar240._8_8_ = 0;
        auVar240._0_8_ = SUB168(auVar233 * auVar641,8);
        auVar2 = auVar240 * ZEXT816(0x1000003d10000) +
                 auVar239 * auVar646 +
                 auVar238 * auVar645 +
                 auVar237 * auVar644 + auVar235 * auVar642 + auVar236 * auVar643 + (auVar1 >> 0x34);
        auVar241._8_8_ = 0;
        auVar241._0_8_ = uVar912;
        auVar647._8_8_ = 0;
        auVar647._0_8_ = uVar883;
        auVar242._8_8_ = 0;
        auVar242._0_8_ = uVar877;
        auVar648._8_8_ = 0;
        auVar648._0_8_ = uVar905;
        auVar243._8_8_ = 0;
        auVar243._0_8_ = uVar881;
        auVar649._8_8_ = 0;
        auVar649._0_8_ = uVar884;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = uVar876;
        auVar650._8_8_ = 0;
        auVar650._0_8_ = uVar902;
        auVar245._8_8_ = 0;
        auVar245._0_8_ = uVar909;
        auVar651._8_8_ = 0;
        auVar651._0_8_ = uVar894;
        auVar3 = auVar245 * auVar651 +
                 auVar244 * auVar650 + auVar243 * auVar649 + auVar242 * auVar648 + (auVar2 >> 0x34);
        auVar246._8_8_ = 0;
        auVar246._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
        auVar4 = auVar241 * auVar647 + auVar246 * ZEXT816(0x1000003d1);
        uVar898 = auVar4._0_8_;
        uVar907 = auVar4._8_8_;
        auVar247._8_8_ = 0;
        auVar247._0_8_ = uVar912;
        auVar652._8_8_ = 0;
        auVar652._0_8_ = uVar894;
        auVar248._8_8_ = 0;
        auVar248._0_8_ = uVar877;
        auVar653._8_8_ = 0;
        auVar653._0_8_ = uVar883;
        auVar845._8_8_ = uVar907 >> 0x34;
        auVar845._0_8_ = uVar907 * 0x1000 | uVar898 >> 0x34;
        auVar249._8_8_ = 0;
        auVar249._0_8_ = uVar881;
        auVar654._8_8_ = 0;
        auVar654._0_8_ = uVar905;
        auVar250._8_8_ = 0;
        auVar250._0_8_ = uVar876;
        auVar655._8_8_ = 0;
        auVar655._0_8_ = uVar884;
        auVar251._8_8_ = 0;
        auVar251._0_8_ = uVar909;
        auVar656._8_8_ = 0;
        auVar656._0_8_ = uVar902;
        auVar3 = auVar251 * auVar656 + auVar250 * auVar655 + auVar249 * auVar654 + (auVar3 >> 0x34);
        auVar252._8_8_ = 0;
        auVar252._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
        auVar845 = auVar252 * ZEXT816(0x1000003d10) + auVar247 * auVar652 + auVar248 * auVar653 +
                   auVar845;
        auVar253._8_8_ = 0;
        auVar253._0_8_ = uVar912;
        auVar657._8_8_ = 0;
        auVar657._0_8_ = uVar902;
        auVar254._8_8_ = 0;
        auVar254._0_8_ = uVar877;
        auVar658._8_8_ = 0;
        auVar658._0_8_ = uVar894;
        auVar255._8_8_ = 0;
        auVar255._0_8_ = uVar881;
        auVar659._8_8_ = 0;
        auVar659._0_8_ = uVar883;
        auVar256._8_8_ = 0;
        auVar256._0_8_ = uVar876;
        auVar660._8_8_ = 0;
        auVar660._0_8_ = uVar905;
        auVar257._8_8_ = 0;
        auVar257._0_8_ = uVar909;
        auVar661._8_8_ = 0;
        auVar661._0_8_ = uVar884;
        auVar3 = auVar257 * auVar661 + auVar256 * auVar660 + (auVar3 >> 0x34);
        auVar258._8_8_ = 0;
        auVar258._0_8_ = auVar3._0_8_;
        auVar4 = auVar258 * ZEXT816(0x1000003d10) +
                 auVar255 * auVar659 + auVar254 * auVar658 + auVar253 * auVar657 +
                 (auVar845 >> 0x34);
        auVar5 = auVar4 >> 0x34;
        auVar847._8_8_ = 0;
        auVar847._0_8_ = auVar5._0_8_;
        auVar259._8_8_ = 0;
        auVar259._0_8_ = auVar3._8_8_;
        auVar846._8_8_ = auVar5._8_8_;
        auVar846._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
        auVar847 = auVar259 * ZEXT816(0x1000003d10000) + auVar846 + auVar847;
        uVar883 = auVar847._0_8_;
        uVar902 = (auVar847._8_8_ << 0xc | uVar883 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
        uVar883 = uVar883 & 0xfffffffffffff;
        auVar260._8_8_ = 0;
        auVar260._0_8_ = uVar883;
        auVar662._8_8_ = 0;
        auVar662._0_8_ = uVar910;
        uVar905 = auVar4._0_8_ & 0xfffffffffffff;
        auVar261._8_8_ = 0;
        auVar261._0_8_ = uVar905;
        auVar663._8_8_ = 0;
        auVar663._0_8_ = uVar900;
        uVar907 = auVar845._0_8_ & 0xfffffffffffff;
        auVar262._8_8_ = 0;
        auVar262._0_8_ = uVar907;
        auVar664._8_8_ = 0;
        auVar664._0_8_ = uVar904;
        uVar898 = uVar898 & 0xfffffffffffff;
        auVar263._8_8_ = 0;
        auVar263._0_8_ = uVar898;
        auVar665._8_8_ = 0;
        auVar665._0_8_ = uVar889;
        auVar264._8_8_ = 0;
        auVar264._0_8_ = uVar902;
        auVar666._8_8_ = 0;
        auVar666._0_8_ = uVar887;
        auVar265._8_8_ = 0;
        auVar265._0_8_ = SUB168(auVar264 * auVar666,0);
        auVar1 = auVar265 * ZEXT816(0x1000003d10) +
                 auVar260 * auVar662 +
                 auVar261 * auVar663 + auVar263 * auVar665 + auVar262 * auVar664;
        auVar266._8_8_ = 0;
        auVar266._0_8_ = uVar902;
        auVar667._8_8_ = 0;
        auVar667._0_8_ = uVar910;
        auVar267._8_8_ = 0;
        auVar267._0_8_ = uVar883;
        auVar668._8_8_ = 0;
        auVar668._0_8_ = uVar900;
        auVar268._8_8_ = 0;
        auVar268._0_8_ = uVar905;
        auVar669._8_8_ = 0;
        auVar669._0_8_ = uVar904;
        auVar269._8_8_ = 0;
        auVar269._0_8_ = uVar907;
        auVar670._8_8_ = 0;
        auVar670._0_8_ = uVar889;
        auVar270._8_8_ = 0;
        auVar270._0_8_ = uVar898;
        auVar671._8_8_ = 0;
        auVar671._0_8_ = uVar887;
        auVar271._8_8_ = 0;
        auVar271._0_8_ = SUB168(auVar264 * auVar666,8);
        auVar2 = auVar271 * ZEXT816(0x1000003d10000) +
                 auVar266 * auVar667 +
                 auVar267 * auVar668 +
                 auVar268 * auVar669 + auVar270 * auVar671 + auVar269 * auVar670 + (auVar1 >> 0x34);
        auVar272._8_8_ = 0;
        auVar272._0_8_ = uVar898;
        auVar672._8_8_ = 0;
        auVar672._0_8_ = uVar910;
        auVar273._8_8_ = 0;
        auVar273._0_8_ = uVar902;
        auVar673._8_8_ = 0;
        auVar673._0_8_ = uVar900;
        auVar274._8_8_ = 0;
        auVar274._0_8_ = uVar883;
        auVar674._8_8_ = 0;
        auVar674._0_8_ = uVar904;
        auVar275._8_8_ = 0;
        auVar275._0_8_ = uVar905;
        auVar675._8_8_ = 0;
        auVar675._0_8_ = uVar889;
        auVar276._8_8_ = 0;
        auVar276._0_8_ = uVar907;
        auVar676._8_8_ = 0;
        auVar676._0_8_ = uVar887;
        auVar3 = auVar276 * auVar676 + auVar275 * auVar675 + auVar274 * auVar674 +
                 auVar273 * auVar673 + (auVar2 >> 0x34);
        auVar277._8_8_ = 0;
        auVar277._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
        auVar4 = auVar272 * auVar672 + auVar277 * ZEXT816(0x1000003d1);
        uVar884 = auVar4._0_8_;
        uVar894 = auVar4._8_8_;
        auVar278._8_8_ = 0;
        auVar278._0_8_ = uVar907;
        auVar677._8_8_ = 0;
        auVar677._0_8_ = uVar910;
        auVar279._8_8_ = 0;
        auVar279._0_8_ = uVar898;
        auVar678._8_8_ = 0;
        auVar678._0_8_ = uVar900;
        auVar280._8_8_ = 0;
        auVar280._0_8_ = uVar902;
        auVar679._8_8_ = 0;
        auVar679._0_8_ = uVar904;
        auVar821._8_8_ = uVar894 >> 0x34;
        auVar821._0_8_ = uVar894 * 0x1000 | uVar884 >> 0x34;
        auVar281._8_8_ = 0;
        auVar281._0_8_ = uVar883;
        auVar680._8_8_ = 0;
        auVar680._0_8_ = uVar889;
        auVar282._8_8_ = 0;
        auVar282._0_8_ = uVar905;
        auVar681._8_8_ = 0;
        auVar681._0_8_ = uVar887;
        auVar3 = auVar280 * auVar679 + auVar282 * auVar681 + auVar281 * auVar680 + (auVar3 >> 0x34);
        auVar283._8_8_ = 0;
        auVar283._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
        auVar821 = auVar283 * ZEXT816(0x1000003d10) + auVar278 * auVar677 + auVar279 * auVar678 +
                   auVar821;
        auVar284._8_8_ = 0;
        auVar284._0_8_ = uVar905;
        auVar682._8_8_ = 0;
        auVar682._0_8_ = uVar910;
        auVar285._8_8_ = 0;
        auVar285._0_8_ = uVar907;
        auVar683._8_8_ = 0;
        auVar683._0_8_ = uVar900;
        auVar286._8_8_ = 0;
        auVar286._0_8_ = uVar898;
        auVar684._8_8_ = 0;
        auVar684._0_8_ = uVar904;
        auVar287._8_8_ = 0;
        auVar287._0_8_ = uVar902;
        auVar685._8_8_ = 0;
        auVar685._0_8_ = uVar889;
        auVar288._8_8_ = 0;
        auVar288._0_8_ = uVar883;
        auVar686._8_8_ = 0;
        auVar686._0_8_ = uVar887;
        auVar3 = auVar288 * auVar686 + auVar287 * auVar685 + (auVar3 >> 0x34);
        auVar289._8_8_ = 0;
        auVar289._0_8_ = auVar3._0_8_;
        auVar4 = auVar289 * ZEXT816(0x1000003d10) +
                 auVar284 * auVar682 + auVar286 * auVar684 + auVar285 * auVar683 +
                 (auVar821 >> 0x34);
        auVar5 = auVar4 >> 0x34;
        auVar849._8_8_ = 0;
        auVar849._0_8_ = auVar5._0_8_;
        auVar290._8_8_ = 0;
        auVar290._0_8_ = auVar3._8_8_;
        auVar848._8_8_ = auVar5._8_8_;
        auVar848._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
        auVar849 = auVar290 * ZEXT816(0x1000003d10000) + auVar848 + auVar849;
        uVar898 = auVar849._0_8_;
        uVar883 = uVar912 * 2;
        auVar291._8_8_ = 0;
        auVar291._0_8_ = uVar876;
        auVar687._8_8_ = 0;
        auVar687._0_8_ = uVar883;
        auVar292._8_8_ = 0;
        auVar292._0_8_ = uVar881;
        auVar688._8_8_ = 0;
        auVar688._0_8_ = uVar877 * 2;
        auVar293._8_8_ = 0;
        auVar293._0_8_ = uVar909;
        auVar689._8_8_ = 0;
        auVar689._0_8_ = uVar909;
        auVar294._8_8_ = 0;
        auVar294._0_8_ = SUB168(auVar293 * auVar689,0);
        auVar1 = auVar292 * auVar688 + auVar291 * auVar687 + auVar294 * ZEXT816(0x1000003d10);
        uVar902 = auVar1._0_8_;
        auVar850._8_8_ = 0;
        auVar850._0_8_ = auVar1._8_8_ << 0xc | uVar902 >> 0x34;
        uVar894 = uVar909 * 2;
        auVar295._8_8_ = 0;
        auVar295._0_8_ = uVar894;
        auVar690._8_8_ = 0;
        auVar690._0_8_ = uVar912;
        auVar296._8_8_ = 0;
        auVar296._0_8_ = uVar876;
        auVar691._8_8_ = 0;
        auVar691._0_8_ = uVar877 * 2;
        auVar297._8_8_ = 0;
        auVar297._0_8_ = uVar881;
        auVar692._8_8_ = 0;
        auVar692._0_8_ = uVar881;
        auVar298._8_8_ = 0;
        auVar298._0_8_ = SUB168(auVar293 * auVar689,8);
        auVar850 = auVar298 * ZEXT816(0x1000003d10000) +
                   auVar295 * auVar690 + auVar297 * auVar692 + auVar296 * auVar691 + auVar850;
        auVar299._8_8_ = 0;
        auVar299._0_8_ = uVar912;
        auVar693._8_8_ = 0;
        auVar693._0_8_ = uVar912;
        auVar300._8_8_ = 0;
        auVar300._0_8_ = uVar894;
        auVar694._8_8_ = 0;
        auVar694._0_8_ = uVar877;
        auVar301._8_8_ = 0;
        auVar301._0_8_ = uVar876;
        auVar695._8_8_ = 0;
        auVar695._0_8_ = uVar881 * 2;
        auVar1 = auVar301 * auVar695 + auVar300 * auVar694 + (auVar850 >> 0x34);
        auVar302._8_8_ = 0;
        auVar302._0_8_ = (auVar1._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar850._6_2_ & 0xf);
        auVar3 = auVar302 * ZEXT816(0x1000003d1) + auVar299 * auVar693;
        uVar910 = auVar3._0_8_;
        auVar870._8_8_ = 0;
        auVar870._0_8_ = auVar3._8_8_ << 0xc | uVar910 >> 0x34;
        auVar303._8_8_ = 0;
        auVar303._0_8_ = uVar877;
        auVar696._8_8_ = 0;
        auVar696._0_8_ = uVar883;
        auVar304._8_8_ = 0;
        auVar304._0_8_ = uVar894;
        auVar697._8_8_ = 0;
        auVar697._0_8_ = uVar881;
        auVar305._8_8_ = 0;
        auVar305._0_8_ = uVar876;
        auVar698._8_8_ = 0;
        auVar698._0_8_ = uVar876;
        auVar1 = auVar304 * auVar697 + auVar305 * auVar698 + (auVar1 >> 0x34);
        auVar306._8_8_ = 0;
        auVar306._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
        auVar870 = auVar303 * auVar696 + auVar306 * ZEXT816(0x1000003d10) + auVar870;
        uVar905 = auVar870._0_8_;
        auVar851._8_8_ = 0;
        auVar851._0_8_ = auVar870._8_8_ * 0x1000 | uVar905 >> 0x34;
        auVar307._8_8_ = 0;
        auVar307._0_8_ = uVar881;
        auVar699._8_8_ = 0;
        auVar699._0_8_ = uVar883;
        auVar308._8_8_ = 0;
        auVar308._0_8_ = uVar877;
        auVar700._8_8_ = 0;
        auVar700._0_8_ = uVar877;
        auVar309._8_8_ = 0;
        auVar309._0_8_ = uVar894;
        auVar701._8_8_ = 0;
        auVar701._0_8_ = uVar876;
        auVar1 = auVar309 * auVar701 + (auVar1 >> 0x34);
        auVar310._8_8_ = 0;
        auVar310._0_8_ = auVar1._0_8_;
        auVar851 = auVar310 * ZEXT816(0x1000003d10) + auVar308 * auVar700 + auVar307 * auVar699 +
                   auVar851;
        auVar3 = auVar851 >> 0x34;
        auVar853._8_8_ = 0;
        auVar853._0_8_ = auVar3._0_8_;
        auVar311._8_8_ = 0;
        auVar311._0_8_ = auVar1._8_8_;
        auVar852._8_8_ = auVar3._8_8_;
        auVar852._0_8_ = uVar902 & 0xffffffffffffe;
        auVar853 = auVar311 * ZEXT816(0x1000003d10000) + auVar852 + auVar853;
        uVar894 = auVar853._0_8_;
        uVar889 = 0x3ffffbfffff0bc - (uVar910 & 0xfffffffffffff);
        uVar900 = 0x3ffffffffffffc - (uVar905 & 0xfffffffffffff);
        uVar907 = 0x3ffffffffffffc - (auVar851._0_8_ & 0xfffffffffffff);
        uVar883 = 0x3ffffffffffffc - (uVar894 & 0xfffffffffffff);
        auVar312._8_8_ = 0;
        auVar312._0_8_ = uVar889;
        auVar702._8_8_ = 0;
        auVar702._0_8_ = uVar876;
        uVar904 = 0x3fffffffffffc -
                  ((auVar853._8_8_ << 0xc | uVar894 >> 0x34) + (auVar850._0_8_ & 0xffffffffffff));
        auVar313._8_8_ = 0;
        auVar313._0_8_ = uVar900;
        auVar703._8_8_ = 0;
        auVar703._0_8_ = uVar881;
        auVar314._8_8_ = 0;
        auVar314._0_8_ = uVar907;
        auVar704._8_8_ = 0;
        auVar704._0_8_ = uVar877;
        auVar315._8_8_ = 0;
        auVar315._0_8_ = uVar883;
        auVar705._8_8_ = 0;
        auVar705._0_8_ = uVar912;
        auVar316._8_8_ = 0;
        auVar316._0_8_ = uVar904;
        auVar706._8_8_ = 0;
        auVar706._0_8_ = uVar909;
        auVar317._8_8_ = 0;
        auVar317._0_8_ = SUB168(auVar316 * auVar706,0);
        auVar6 = auVar313 * auVar703 + auVar312 * auVar702 + auVar314 * auVar704 +
                 auVar315 * auVar705 + auVar317 * ZEXT816(0x1000003d10);
        auVar318._8_8_ = 0;
        auVar318._0_8_ = uVar889;
        auVar707._8_8_ = 0;
        auVar707._0_8_ = uVar909;
        auVar319._8_8_ = 0;
        auVar319._0_8_ = uVar900;
        auVar708._8_8_ = 0;
        auVar708._0_8_ = uVar876;
        auVar320._8_8_ = 0;
        auVar320._0_8_ = uVar907;
        auVar709._8_8_ = 0;
        auVar709._0_8_ = uVar881;
        auVar321._8_8_ = 0;
        auVar321._0_8_ = uVar883;
        auVar710._8_8_ = 0;
        auVar710._0_8_ = uVar877;
        auVar322._8_8_ = 0;
        auVar322._0_8_ = uVar904;
        auVar711._8_8_ = 0;
        auVar711._0_8_ = uVar912;
        auVar323._8_8_ = 0;
        auVar323._0_8_ = SUB168(auVar316 * auVar706,8);
        auVar1 = auVar323 * ZEXT816(0x1000003d10000) +
                 auVar322 * auVar711 +
                 auVar321 * auVar710 +
                 auVar320 * auVar709 + auVar318 * auVar707 + auVar319 * auVar708 + (auVar6 >> 0x34);
        auVar324._8_8_ = 0;
        auVar324._0_8_ = uVar889;
        auVar712._8_8_ = 0;
        auVar712._0_8_ = uVar912;
        auVar325._8_8_ = 0;
        auVar325._0_8_ = uVar900;
        auVar713._8_8_ = 0;
        auVar713._0_8_ = uVar909;
        auVar326._8_8_ = 0;
        auVar326._0_8_ = uVar907;
        auVar714._8_8_ = 0;
        auVar714._0_8_ = uVar876;
        auVar327._8_8_ = 0;
        auVar327._0_8_ = uVar883;
        auVar715._8_8_ = 0;
        auVar715._0_8_ = uVar881;
        auVar328._8_8_ = 0;
        auVar328._0_8_ = uVar904;
        auVar716._8_8_ = 0;
        auVar716._0_8_ = uVar877;
        auVar3 = auVar328 * auVar716 +
                 auVar327 * auVar715 + auVar326 * auVar714 + auVar325 * auVar713 + (auVar1 >> 0x34);
        auVar329._8_8_ = 0;
        auVar329._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
        auVar5 = auVar324 * auVar712 + auVar329 * ZEXT816(0x1000003d1);
        uVar902 = auVar5._0_8_;
        auVar854._8_8_ = 0;
        auVar854._0_8_ = auVar5._8_8_ * 0x1000 | uVar902 >> 0x34;
        auVar330._8_8_ = 0;
        auVar330._0_8_ = uVar889;
        auVar717._8_8_ = 0;
        auVar717._0_8_ = uVar877;
        auVar331._8_8_ = 0;
        auVar331._0_8_ = uVar900;
        auVar718._8_8_ = 0;
        auVar718._0_8_ = uVar912;
        uVar902 = uVar902 & 0xfffffffffffff;
        auVar332._8_8_ = 0;
        auVar332._0_8_ = uVar907;
        auVar719._8_8_ = 0;
        auVar719._0_8_ = uVar909;
        auVar333._8_8_ = 0;
        auVar333._0_8_ = uVar883;
        auVar720._8_8_ = 0;
        auVar720._0_8_ = uVar876;
        auVar334._8_8_ = 0;
        auVar334._0_8_ = uVar904;
        auVar721._8_8_ = 0;
        auVar721._0_8_ = uVar881;
        auVar3 = auVar334 * auVar721 + auVar333 * auVar720 + auVar332 * auVar719 + (auVar3 >> 0x34);
        auVar335._8_8_ = 0;
        auVar335._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
        auVar854 = auVar335 * ZEXT816(0x1000003d10) + auVar331 * auVar718 + auVar330 * auVar717 +
                   auVar854;
        auVar336._8_8_ = 0;
        auVar336._0_8_ = uVar889;
        auVar722._8_8_ = 0;
        auVar722._0_8_ = uVar881;
        auVar337._8_8_ = 0;
        auVar337._0_8_ = uVar900;
        auVar723._8_8_ = 0;
        auVar723._0_8_ = uVar877;
        auVar338._8_8_ = 0;
        auVar338._0_8_ = uVar907;
        auVar724._8_8_ = 0;
        auVar724._0_8_ = uVar912;
        uVar877 = auVar854._0_8_ & 0xfffffffffffff;
        auVar339._8_8_ = 0;
        auVar339._0_8_ = uVar883;
        auVar725._8_8_ = 0;
        auVar725._0_8_ = uVar909;
        auVar340._8_8_ = 0;
        auVar340._0_8_ = uVar904;
        auVar726._8_8_ = 0;
        auVar726._0_8_ = uVar876;
        auVar3 = auVar340 * auVar726 + auVar339 * auVar725 + (auVar3 >> 0x34);
        auVar341._8_8_ = 0;
        auVar341._0_8_ = auVar3._0_8_;
        auVar5 = auVar341 * ZEXT816(0x1000003d10) +
                 auVar338 * auVar724 + auVar337 * auVar723 + auVar336 * auVar722 +
                 (auVar854 >> 0x34);
        auVar7 = auVar5 >> 0x34;
        auVar856._8_8_ = 0;
        auVar856._0_8_ = auVar7._0_8_;
        uVar909 = auVar5._0_8_ & 0xfffffffffffff;
        auVar342._8_8_ = 0;
        auVar342._0_8_ = auVar3._8_8_;
        auVar855._8_8_ = auVar7._8_8_;
        auVar855._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
        auVar856 = auVar342 * ZEXT816(0x1000003d10000) + auVar855 + auVar856;
        uVar912 = auVar856._0_8_;
        auVar343._8_8_ = 0;
        auVar343._0_8_ = uVar880;
        auVar727._8_8_ = 0;
        auVar727._0_8_ = uVar883;
        auVar344._8_8_ = 0;
        auVar344._0_8_ = uVar886;
        auVar728._8_8_ = 0;
        auVar728._0_8_ = uVar907;
        auVar345._8_8_ = 0;
        auVar345._0_8_ = uVar890;
        auVar729._8_8_ = 0;
        auVar729._0_8_ = uVar900;
        uVar887 = (auVar856._8_8_ << 0xc | uVar912 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
        auVar346._8_8_ = 0;
        auVar346._0_8_ = uVar895;
        auVar730._8_8_ = 0;
        auVar730._0_8_ = uVar889;
        auVar347._8_8_ = 0;
        auVar347._0_8_ = uVar904;
        auVar731._8_8_ = 0;
        auVar731._0_8_ = uVar908;
        auVar348._8_8_ = 0;
        auVar348._0_8_ = SUB168(auVar347 * auVar731,0);
        uVar912 = uVar912 & 0xfffffffffffff;
        auVar1 = auVar348 * ZEXT816(0x1000003d10) +
                 auVar343 * auVar727 +
                 auVar344 * auVar728 + auVar345 * auVar729 + auVar346 * auVar730;
        auVar349._8_8_ = 0;
        auVar349._0_8_ = uVar880;
        auVar732._8_8_ = 0;
        auVar732._0_8_ = uVar904;
        auVar350._8_8_ = 0;
        auVar350._0_8_ = uVar886;
        auVar733._8_8_ = 0;
        auVar733._0_8_ = uVar883;
        auVar351._8_8_ = 0;
        auVar351._0_8_ = uVar890;
        auVar734._8_8_ = 0;
        auVar734._0_8_ = uVar907;
        auVar352._8_8_ = 0;
        auVar352._0_8_ = uVar895;
        auVar735._8_8_ = 0;
        auVar735._0_8_ = uVar900;
        auVar353._8_8_ = 0;
        auVar353._0_8_ = uVar889;
        auVar736._8_8_ = 0;
        auVar736._0_8_ = uVar908;
        auVar354._8_8_ = 0;
        auVar354._0_8_ = SUB168(auVar347 * auVar731,8);
        auVar3 = auVar354 * ZEXT816(0x1000003d10000) +
                 auVar349 * auVar732 +
                 auVar353 * auVar736 + auVar352 * auVar735 + auVar351 * auVar734 +
                 auVar350 * auVar733 + (auVar1 >> 0x34);
        auVar355._8_8_ = 0;
        auVar355._0_8_ = uVar880;
        auVar737._8_8_ = 0;
        auVar737._0_8_ = uVar889;
        auVar356._8_8_ = 0;
        auVar356._0_8_ = uVar886;
        auVar738._8_8_ = 0;
        auVar738._0_8_ = uVar904;
        auVar357._8_8_ = 0;
        auVar357._0_8_ = uVar890;
        auVar739._8_8_ = 0;
        auVar739._0_8_ = uVar883;
        auVar358._8_8_ = 0;
        auVar358._0_8_ = uVar895;
        auVar740._8_8_ = 0;
        auVar740._0_8_ = uVar907;
        auVar359._8_8_ = 0;
        auVar359._0_8_ = uVar900;
        auVar741._8_8_ = 0;
        auVar741._0_8_ = uVar908;
        auVar5 = (auVar3 >> 0x34) +
                 auVar359 * auVar741 + auVar358 * auVar740 + auVar357 * auVar739 +
                 auVar356 * auVar738;
        uVar894 = auVar5._0_8_;
        uVar905 = auVar5._8_8_;
        auVar857._8_8_ = uVar905 >> 0x34;
        auVar857._0_8_ = uVar905 * 0x1000 | uVar894 >> 0x34;
        auVar360._8_8_ = 0;
        auVar360._0_8_ = uVar894 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar3._6_2_ & 0xf);
        auVar5 = auVar355 * auVar737 + auVar360 * ZEXT816(0x1000003d1);
        uVar905 = auVar5._0_8_;
        auVar871._8_8_ = 0;
        auVar871._0_8_ = auVar5._8_8_ * 0x1000 | uVar905 >> 0x34;
        auVar361._8_8_ = 0;
        auVar361._0_8_ = uVar880;
        auVar742._8_8_ = 0;
        auVar742._0_8_ = uVar900;
        auVar362._8_8_ = 0;
        auVar362._0_8_ = uVar886;
        auVar743._8_8_ = 0;
        auVar743._0_8_ = uVar889;
        auVar363._8_8_ = 0;
        auVar363._0_8_ = uVar890;
        auVar744._8_8_ = 0;
        auVar744._0_8_ = uVar904;
        uVar905 = uVar905 & 0xfffffffffffff;
        auVar364._8_8_ = 0;
        auVar364._0_8_ = uVar895;
        auVar745._8_8_ = 0;
        auVar745._0_8_ = uVar883;
        auVar365._8_8_ = 0;
        auVar365._0_8_ = uVar907;
        auVar746._8_8_ = 0;
        auVar746._0_8_ = uVar908;
        auVar857 = auVar363 * auVar744 + auVar365 * auVar746 + auVar364 * auVar745 + auVar857;
        auVar366._8_8_ = 0;
        auVar366._0_8_ = auVar857._0_8_ & 0xfffffffffffff;
        auVar871 = auVar366 * ZEXT816(0x1000003d10) + auVar361 * auVar742 + auVar362 * auVar743 +
                   auVar871;
        uVar910 = auVar871._0_8_;
        uVar894 = auVar871._8_8_;
        auVar822._8_8_ = uVar894 >> 0x34;
        auVar822._0_8_ = uVar894 * 0x1000 | uVar910 >> 0x34;
        auVar367._8_8_ = 0;
        auVar367._0_8_ = uVar880;
        auVar747._8_8_ = 0;
        auVar747._0_8_ = uVar907;
        auVar368._8_8_ = 0;
        auVar368._0_8_ = uVar886;
        auVar748._8_8_ = 0;
        auVar748._0_8_ = uVar900;
        auVar369._8_8_ = 0;
        auVar369._0_8_ = uVar890;
        auVar749._8_8_ = 0;
        auVar749._0_8_ = uVar889;
        uVar910 = uVar910 & 0xfffffffffffff;
        auVar370._8_8_ = 0;
        auVar370._0_8_ = uVar895;
        auVar750._8_8_ = 0;
        auVar750._0_8_ = uVar904;
        auVar371._8_8_ = 0;
        auVar371._0_8_ = uVar883;
        auVar751._8_8_ = 0;
        auVar751._0_8_ = uVar908;
        auVar5 = auVar371 * auVar751 + auVar370 * auVar750 + (auVar857 >> 0x34);
        auVar372._8_8_ = 0;
        auVar372._0_8_ = auVar5._0_8_;
        auVar822 = auVar372 * ZEXT816(0x1000003d10) +
                   auVar367 * auVar747 + auVar369 * auVar749 + auVar368 * auVar748 + auVar822;
        auVar6 = auVar822 >> 0x34;
        auVar859._8_8_ = 0;
        auVar859._0_8_ = auVar6._0_8_;
        uVar889 = auVar822._0_8_ & 0xfffffffffffff;
        auVar373._8_8_ = 0;
        auVar373._0_8_ = auVar5._8_8_;
        auVar858._8_8_ = auVar6._8_8_;
        auVar858._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
        auVar859 = auVar373 * ZEXT816(0x1000003d10000) + auVar858 + auVar859;
        uVar900 = auVar859._0_8_;
        lVar885 = (auVar859._8_8_ << 0xc | uVar900 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff);
        uVar883 = uVar891 * 2;
        auVar374._8_8_ = 0;
        auVar374._0_8_ = uVar896;
        auVar752._8_8_ = 0;
        auVar752._0_8_ = uVar883;
        uVar900 = uVar900 & 0xfffffffffffff;
        auVar375._8_8_ = 0;
        auVar375._0_8_ = uVar892;
        auVar753._8_8_ = 0;
        auVar753._0_8_ = uVar903 * 2;
        auVar376._8_8_ = 0;
        auVar376._0_8_ = uVar901;
        auVar754._8_8_ = 0;
        auVar754._0_8_ = uVar901;
        auVar377._8_8_ = 0;
        auVar377._0_8_ = SUB168(auVar376 * auVar754,0);
        auVar1 = auVar377 * ZEXT816(0x1000003d10) + auVar375 * auVar753 + auVar374 * auVar752;
        uVar904 = auVar1._0_8_;
        auVar860._8_8_ = 0;
        auVar860._0_8_ = auVar1._8_8_ << 0xc | uVar904 >> 0x34;
        uVar894 = uVar901 * 2;
        auVar378._8_8_ = 0;
        auVar378._0_8_ = uVar894;
        auVar755._8_8_ = 0;
        auVar755._0_8_ = uVar891;
        r->infinity = 0;
        auVar379._8_8_ = 0;
        auVar379._0_8_ = uVar896;
        auVar756._8_8_ = 0;
        auVar756._0_8_ = uVar903 * 2;
        auVar380._8_8_ = 0;
        auVar380._0_8_ = uVar892;
        auVar757._8_8_ = 0;
        auVar757._0_8_ = uVar892;
        auVar381._8_8_ = 0;
        auVar381._0_8_ = SUB168(auVar376 * auVar754,8);
        (r->z).n[0] = uVar884 & 0xfffffffffffff;
        (r->z).n[1] = auVar821._0_8_ & 0xfffffffffffff;
        auVar860 = auVar379 * auVar756 + auVar380 * auVar757 + auVar378 * auVar755 +
                   auVar381 * ZEXT816(0x1000003d10000) + auVar860;
        (r->z).n[2] = auVar4._0_8_ & 0xfffffffffffff;
        auVar382._8_8_ = 0;
        auVar382._0_8_ = uVar891;
        auVar758._8_8_ = 0;
        auVar758._0_8_ = uVar891;
        auVar383._8_8_ = 0;
        auVar383._0_8_ = uVar894;
        auVar759._8_8_ = 0;
        auVar759._0_8_ = uVar903;
        auVar384._8_8_ = 0;
        auVar384._0_8_ = uVar896;
        auVar760._8_8_ = 0;
        auVar760._0_8_ = uVar892 * 2;
        auVar1 = auVar384 * auVar760 + auVar383 * auVar759 + (auVar860 >> 0x34);
        auVar385._8_8_ = 0;
        auVar385._0_8_ = (auVar1._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar860._6_2_ & 0xf);
        auVar3 = auVar385 * ZEXT816(0x1000003d1) + auVar382 * auVar758;
        uVar884 = auVar3._0_8_;
        auVar872._8_8_ = 0;
        auVar872._0_8_ = auVar3._8_8_ << 0xc | uVar884 >> 0x34;
        auVar386._8_8_ = 0;
        auVar386._0_8_ = uVar903;
        auVar761._8_8_ = 0;
        auVar761._0_8_ = uVar883;
        auVar387._8_8_ = 0;
        auVar387._0_8_ = uVar894;
        auVar762._8_8_ = 0;
        auVar762._0_8_ = uVar892;
        auVar388._8_8_ = 0;
        auVar388._0_8_ = uVar896;
        auVar763._8_8_ = 0;
        auVar763._0_8_ = uVar896;
        auVar1 = auVar388 * auVar763 + auVar387 * auVar762 + (auVar1 >> 0x34);
        auVar389._8_8_ = 0;
        auVar389._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
        auVar872 = auVar386 * auVar761 + auVar389 * ZEXT816(0x1000003d10) + auVar872;
        uVar876 = auVar872._0_8_;
        auVar861._8_8_ = 0;
        auVar861._0_8_ = auVar872._8_8_ * 0x1000 | uVar876 >> 0x34;
        auVar390._8_8_ = 0;
        auVar390._0_8_ = uVar892;
        auVar764._8_8_ = 0;
        auVar764._0_8_ = uVar883;
        auVar391._8_8_ = 0;
        auVar391._0_8_ = uVar903;
        auVar765._8_8_ = 0;
        auVar765._0_8_ = uVar903;
        auVar392._8_8_ = 0;
        auVar392._0_8_ = uVar894;
        auVar766._8_8_ = 0;
        auVar766._0_8_ = uVar896;
        auVar1 = auVar392 * auVar766 + (auVar1 >> 0x34);
        auVar393._8_8_ = 0;
        auVar393._0_8_ = auVar1._0_8_;
        auVar861 = auVar390 * auVar764 + auVar391 * auVar765 + auVar393 * ZEXT816(0x1000003d10) +
                   auVar861;
        auVar3 = auVar861 >> 0x34;
        auVar862._8_8_ = auVar3._8_8_;
        auVar862._0_8_ = uVar904 & 0xffffffffffffe;
        auVar863._8_8_ = 0;
        auVar863._0_8_ = auVar3._0_8_;
        auVar394._8_8_ = 0;
        auVar394._0_8_ = auVar1._8_8_;
        (r->z).n[3] = uVar898 & 0xfffffffffffff;
        auVar863 = auVar394 * ZEXT816(0x1000003d10000) + auVar862 + auVar863;
        uVar883 = auVar863._0_8_;
        (r->z).n[4] = (auVar849._8_8_ << 0xc | uVar898 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
        uVar888 = (uVar884 & 0xfffffffffffff) + uVar902 + uVar905 * 2;
        uVar906 = (uVar876 & 0xfffffffffffff) + uVar877 + uVar910 * 2;
        uVar893 = (auVar861._0_8_ & 0xfffffffffffff) + uVar909 + uVar889 * 2;
        uVar897 = (uVar883 & 0xfffffffffffff) + uVar912 + uVar900 * 2;
        uVar913 = (auVar863._8_8_ << 0xc | uVar883 >> 0x34) + (auVar860._0_8_ & 0xffffffffffff) +
                  uVar887 + lVar885 * 2;
        (r->x).n[0] = uVar888;
        uVar905 = uVar888 + uVar905;
        (r->x).n[1] = uVar906;
        uVar910 = uVar906 + uVar910;
        (r->x).n[2] = uVar893;
        uVar889 = uVar893 + uVar889;
        (r->x).n[3] = uVar897;
        uVar900 = uVar897 + uVar900;
        (r->x).n[4] = uVar913;
        auVar395._8_8_ = 0;
        auVar395._0_8_ = uVar905;
        auVar767._8_8_ = 0;
        auVar767._0_8_ = uVar896;
        uVar880 = uVar913 + lVar885;
        auVar396._8_8_ = 0;
        auVar396._0_8_ = uVar910;
        auVar768._8_8_ = 0;
        auVar768._0_8_ = uVar892;
        auVar397._8_8_ = 0;
        auVar397._0_8_ = uVar889;
        auVar769._8_8_ = 0;
        auVar769._0_8_ = uVar903;
        auVar398._8_8_ = 0;
        auVar398._0_8_ = uVar900;
        auVar770._8_8_ = 0;
        auVar770._0_8_ = uVar891;
        auVar399._8_8_ = 0;
        auVar399._0_8_ = uVar880;
        auVar771._8_8_ = 0;
        auVar771._0_8_ = uVar901;
        auVar400._8_8_ = 0;
        auVar400._0_8_ = SUB168(auVar399 * auVar771,0);
        auVar3 = auVar396 * auVar768 + auVar395 * auVar767 + auVar397 * auVar769 +
                 auVar398 * auVar770 + auVar400 * ZEXT816(0x1000003d10);
        auVar401._8_8_ = 0;
        auVar401._0_8_ = uVar905;
        auVar772._8_8_ = 0;
        auVar772._0_8_ = uVar901;
        auVar402._8_8_ = 0;
        auVar402._0_8_ = uVar910;
        auVar773._8_8_ = 0;
        auVar773._0_8_ = uVar896;
        auVar403._8_8_ = 0;
        auVar403._0_8_ = uVar889;
        auVar774._8_8_ = 0;
        auVar774._0_8_ = uVar892;
        auVar404._8_8_ = 0;
        auVar404._0_8_ = uVar900;
        auVar775._8_8_ = 0;
        auVar775._0_8_ = uVar903;
        auVar405._8_8_ = 0;
        auVar405._0_8_ = uVar880;
        auVar776._8_8_ = 0;
        auVar776._0_8_ = uVar891;
        auVar406._8_8_ = 0;
        auVar406._0_8_ = SUB168(auVar399 * auVar771,8);
        auVar1 = auVar406 * ZEXT816(0x1000003d10000) +
                 auVar405 * auVar776 +
                 auVar404 * auVar775 +
                 auVar403 * auVar774 + auVar401 * auVar772 + auVar402 * auVar773 + (auVar3 >> 0x34);
        auVar407._8_8_ = 0;
        auVar407._0_8_ = uVar905;
        auVar777._8_8_ = 0;
        auVar777._0_8_ = uVar891;
        auVar408._8_8_ = 0;
        auVar408._0_8_ = uVar910;
        auVar778._8_8_ = 0;
        auVar778._0_8_ = uVar901;
        auVar409._8_8_ = 0;
        auVar409._0_8_ = uVar889;
        auVar779._8_8_ = 0;
        auVar779._0_8_ = uVar896;
        auVar410._8_8_ = 0;
        auVar410._0_8_ = uVar900;
        auVar780._8_8_ = 0;
        auVar780._0_8_ = uVar892;
        auVar411._8_8_ = 0;
        auVar411._0_8_ = uVar880;
        auVar781._8_8_ = 0;
        auVar781._0_8_ = uVar903;
        auVar2 = auVar411 * auVar781 +
                 auVar410 * auVar780 + auVar408 * auVar778 + auVar409 * auVar779 + (auVar1 >> 0x34);
        auVar412._8_8_ = 0;
        auVar412._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
        auVar4 = auVar407 * auVar777 + auVar412 * ZEXT816(0x1000003d1);
        uVar883 = auVar4._0_8_;
        uVar894 = auVar4._8_8_;
        auVar873._8_8_ = uVar894 >> 0x34;
        auVar873._0_8_ = uVar894 * 0x1000 | uVar883 >> 0x34;
        auVar413._8_8_ = 0;
        auVar413._0_8_ = uVar905;
        auVar782._8_8_ = 0;
        auVar782._0_8_ = uVar903;
        auVar414._8_8_ = 0;
        auVar414._0_8_ = uVar910;
        auVar783._8_8_ = 0;
        auVar783._0_8_ = uVar891;
        auVar415._8_8_ = 0;
        auVar415._0_8_ = uVar889;
        auVar784._8_8_ = 0;
        auVar784._0_8_ = uVar901;
        auVar416._8_8_ = 0;
        auVar416._0_8_ = uVar900;
        auVar785._8_8_ = 0;
        auVar785._0_8_ = uVar896;
        auVar417._8_8_ = 0;
        auVar417._0_8_ = uVar880;
        auVar786._8_8_ = 0;
        auVar786._0_8_ = uVar892;
        auVar2 = (auVar2 >> 0x34) + auVar417 * auVar786 + auVar416 * auVar785 + auVar415 * auVar784;
        uVar884 = auVar2._0_8_;
        uVar876 = auVar2._8_8_;
        auVar418._8_8_ = 0;
        auVar418._0_8_ = uVar884 & 0xfffffffffffff;
        auVar873 = auVar418 * ZEXT816(0x1000003d10) + auVar413 * auVar782 + auVar414 * auVar783 +
                   auVar873;
        uVar904 = auVar873._0_8_;
        uVar894 = auVar873._8_8_;
        auVar823._8_8_ = uVar876 >> 0x34;
        auVar823._0_8_ = uVar876 * 0x1000 | uVar884 >> 0x34;
        auVar824._8_8_ = uVar894 >> 0x34;
        auVar824._0_8_ = uVar894 * 0x1000 | uVar904 >> 0x34;
        auVar419._8_8_ = 0;
        auVar419._0_8_ = uVar905;
        auVar787._8_8_ = 0;
        auVar787._0_8_ = uVar892;
        auVar420._8_8_ = 0;
        auVar420._0_8_ = uVar910;
        auVar788._8_8_ = 0;
        auVar788._0_8_ = uVar903;
        auVar421._8_8_ = 0;
        auVar421._0_8_ = uVar889;
        auVar789._8_8_ = 0;
        auVar789._0_8_ = uVar891;
        auVar422._8_8_ = 0;
        auVar422._0_8_ = uVar900;
        auVar790._8_8_ = 0;
        auVar790._0_8_ = uVar901;
        auVar423._8_8_ = 0;
        auVar423._0_8_ = uVar880;
        auVar791._8_8_ = 0;
        auVar791._0_8_ = uVar896;
        auVar823 = auVar423 * auVar791 + auVar422 * auVar790 + auVar823;
        auVar424._8_8_ = 0;
        auVar424._0_8_ = auVar823._0_8_;
        auVar824 = auVar424 * ZEXT816(0x1000003d10) +
                   auVar421 * auVar789 + auVar419 * auVar787 + auVar420 * auVar788 + auVar824;
        auVar2 = auVar824 >> 0x34;
        auVar865._8_8_ = 0;
        auVar865._0_8_ = auVar2._0_8_;
        auVar425._8_8_ = 0;
        auVar425._0_8_ = auVar823._8_8_;
        auVar864._8_8_ = auVar2._8_8_;
        auVar864._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
        auVar865 = auVar425 * ZEXT816(0x1000003d10000) + auVar864 + auVar865;
        uVar894 = auVar865._0_8_;
        auVar426._8_8_ = 0;
        auVar426._0_8_ = uVar902;
        auVar792._8_8_ = 0;
        auVar792._0_8_ = uVar878;
        auVar427._8_8_ = 0;
        auVar427._0_8_ = uVar877;
        auVar793._8_8_ = 0;
        auVar793._0_8_ = uVar879;
        auVar428._8_8_ = 0;
        auVar428._0_8_ = uVar909;
        auVar794._8_8_ = 0;
        auVar794._0_8_ = uVar882;
        auVar429._8_8_ = 0;
        auVar429._0_8_ = uVar912;
        auVar795._8_8_ = 0;
        auVar795._0_8_ = uVar875;
        auVar430._8_8_ = 0;
        auVar430._0_8_ = uVar887;
        auVar796._8_8_ = 0;
        auVar796._0_8_ = uVar899;
        auVar431._8_8_ = 0;
        auVar431._0_8_ = SUB168(auVar430 * auVar796,0);
        auVar4 = auVar427 * auVar793 + auVar426 * auVar792 + auVar428 * auVar794 +
                 auVar429 * auVar795 + auVar431 * ZEXT816(0x1000003d10);
        auVar432._8_8_ = 0;
        auVar432._0_8_ = uVar902;
        auVar797._8_8_ = 0;
        auVar797._0_8_ = uVar899;
        auVar433._8_8_ = 0;
        auVar433._0_8_ = uVar877;
        auVar798._8_8_ = 0;
        auVar798._0_8_ = uVar878;
        auVar434._8_8_ = 0;
        auVar434._0_8_ = uVar909;
        auVar799._8_8_ = 0;
        auVar799._0_8_ = uVar879;
        auVar435._8_8_ = 0;
        auVar435._0_8_ = uVar912;
        auVar800._8_8_ = 0;
        auVar800._0_8_ = uVar882;
        auVar436._8_8_ = 0;
        auVar436._0_8_ = uVar875;
        auVar801._8_8_ = 0;
        auVar801._0_8_ = uVar887;
        auVar437._8_8_ = 0;
        auVar437._0_8_ = SUB168(auVar430 * auVar796,8);
        auVar2 = auVar437 * ZEXT816(0x1000003d10000) +
                 auVar436 * auVar801 +
                 auVar435 * auVar800 +
                 auVar434 * auVar799 + auVar433 * auVar798 + auVar432 * auVar797 + (auVar4 >> 0x34);
        auVar438._8_8_ = 0;
        auVar438._0_8_ = uVar902;
        auVar802._8_8_ = 0;
        auVar802._0_8_ = uVar875;
        auVar439._8_8_ = 0;
        auVar439._0_8_ = uVar877;
        auVar803._8_8_ = 0;
        auVar803._0_8_ = uVar899;
        auVar440._8_8_ = 0;
        auVar440._0_8_ = uVar909;
        auVar804._8_8_ = 0;
        auVar804._0_8_ = uVar878;
        auVar441._8_8_ = 0;
        auVar441._0_8_ = uVar912;
        auVar805._8_8_ = 0;
        auVar805._0_8_ = uVar879;
        auVar442._8_8_ = 0;
        auVar442._0_8_ = uVar882;
        auVar806._8_8_ = 0;
        auVar806._0_8_ = uVar887;
        auVar3 = auVar442 * auVar806 +
                 auVar441 * auVar805 + auVar440 * auVar804 + auVar439 * auVar803 + (auVar2 >> 0x34);
        auVar443._8_8_ = 0;
        auVar443._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
        auVar5 = auVar438 * auVar802 + auVar443 * ZEXT816(0x1000003d1);
        uVar884 = auVar5._0_8_;
        auVar866._8_8_ = 0;
        auVar866._0_8_ = auVar5._8_8_ * 0x1000 | uVar884 >> 0x34;
        auVar444._8_8_ = 0;
        auVar444._0_8_ = uVar902;
        auVar807._8_8_ = 0;
        auVar807._0_8_ = uVar882;
        auVar445._8_8_ = 0;
        auVar445._0_8_ = uVar877;
        auVar808._8_8_ = 0;
        auVar808._0_8_ = uVar875;
        auVar446._8_8_ = 0;
        auVar446._0_8_ = uVar909;
        auVar809._8_8_ = 0;
        auVar809._0_8_ = uVar899;
        auVar447._8_8_ = 0;
        auVar447._0_8_ = uVar912;
        auVar810._8_8_ = 0;
        auVar810._0_8_ = uVar878;
        auVar448._8_8_ = 0;
        auVar448._0_8_ = uVar879;
        auVar811._8_8_ = 0;
        auVar811._0_8_ = uVar887;
        auVar3 = auVar448 * auVar811 + auVar447 * auVar810 + auVar446 * auVar809 + (auVar3 >> 0x34);
        auVar449._8_8_ = 0;
        auVar449._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
        auVar866 = auVar449 * ZEXT816(0x1000003d10) + auVar444 * auVar807 + auVar445 * auVar808 +
                   auVar866;
        uVar905 = auVar866._0_8_;
        auVar867._8_8_ = 0;
        auVar867._0_8_ = auVar866._8_8_ << 0xc | uVar905 >> 0x34;
        auVar450._8_8_ = 0;
        auVar450._0_8_ = uVar902;
        auVar812._8_8_ = 0;
        auVar812._0_8_ = uVar879;
        auVar451._8_8_ = 0;
        auVar451._0_8_ = uVar877;
        auVar813._8_8_ = 0;
        auVar813._0_8_ = uVar882;
        auVar452._8_8_ = 0;
        auVar452._0_8_ = uVar909;
        auVar814._8_8_ = 0;
        auVar814._0_8_ = uVar875;
        auVar453._8_8_ = 0;
        auVar453._0_8_ = uVar912;
        auVar815._8_8_ = 0;
        auVar815._0_8_ = uVar899;
        auVar454._8_8_ = 0;
        auVar454._0_8_ = uVar878;
        auVar816._8_8_ = 0;
        auVar816._0_8_ = uVar887;
        auVar3 = auVar454 * auVar816 + auVar453 * auVar815 + (auVar3 >> 0x34);
        auVar455._8_8_ = 0;
        auVar455._0_8_ = auVar3._0_8_;
        auVar867 = auVar455 * ZEXT816(0x1000003d10) +
                   auVar452 * auVar814 + auVar451 * auVar813 + auVar450 * auVar812 + auVar867;
        auVar5 = auVar867 >> 0x34;
        auVar869._8_8_ = 0;
        auVar869._0_8_ = auVar5._0_8_;
        auVar456._8_8_ = 0;
        auVar456._0_8_ = auVar3._8_8_;
        auVar868._8_8_ = auVar5._8_8_;
        auVar868._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
        auVar869 = auVar456 * ZEXT816(0x1000003d10000) + auVar868 + auVar869;
        uVar902 = auVar869._0_8_;
        (r->y).n[0] = (uVar884 & 0xfffffffffffff) + (uVar883 & 0xfffffffffffff);
        (r->y).n[1] = (uVar905 & 0xfffffffffffff) + (uVar904 & 0xfffffffffffff);
        (r->y).n[2] = (auVar867._0_8_ & 0xfffffffffffff) + (auVar824._0_8_ & 0xfffffffffffff);
        (r->y).n[3] = (uVar902 & 0xfffffffffffff) + (uVar894 & 0xfffffffffffff);
        (r->y).n[4] = (auVar869._8_8_ << 0xc | uVar902 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff) +
                      (auVar865._8_8_ << 0xc | uVar894 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
        return;
      }
      iVar874 = secp256k1_fe_impl_normalizes_to_zero_var(&local_80);
      if (iVar874 == 0) {
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        (r->x).n[4] = 0;
        (r->y).n[0] = 0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
        return;
      }
      secp256k1_gej_double(r,a);
      return;
    }
    lVar885 = 0x10;
  }
  else {
    lVar885 = 0x10;
    a = b;
  }
  for (; lVar885 != 0; lVar885 = lVar885 + -1) {
    (r->x).n[0] = (a->x).n[0];
    a = (secp256k1_gej *)((a->x).n + 1);
    r = (secp256k1_gej *)((r->x).n + 1);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}